

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O2

void Term_queue_char(term *t,wchar_t x,wchar_t y,wchar_t a,wchar_t c,wchar_t ta,wchar_t tc)

{
  wchar_t wVar1;
  term_win *ptVar2;
  int *piVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  int iVar10;
  long lVar11;
  
  ptVar2 = t->scr;
  lVar11 = (long)y;
  piVar3 = ptVar2->ta[lVar11];
  pwVar4 = ptVar2->tc[lVar11];
  wVar7 = piVar3[x];
  if (ta == L'\0') {
    ta = wVar7;
  }
  wVar8 = pwVar4[x];
  if (tc == L'\0') {
    tc = wVar8;
  }
  pwVar5 = ptVar2->c[lVar11];
  wVar6 = ptVar2->a[lVar11][x];
  wVar1 = pwVar5[x];
  if ((((wVar6 != a) || (wVar1 != c)) || (wVar7 != ta)) || (wVar8 != tc)) {
    ptVar2->a[lVar11][x] = a;
    pwVar5[x] = c;
    piVar3[x] = ta;
    pwVar4[x] = tc;
    if (y < t->y1) {
      t->y1 = y;
    }
    if (t->y2 < y) {
      t->y2 = y;
    }
    if (x < t->x1[lVar11]) {
      t->x1[lVar11] = x;
    }
    if (t->x2[lVar11] < x) {
      t->x2[lVar11] = x;
    }
    if (t->dblh_hook != (_func_wchar_t_wchar_t_wchar_t *)0x0) {
      wVar9 = (wchar_t)tile_height;
      if (wVar9 <= y) {
        wVar6 = (*t->dblh_hook)(wVar6,wVar1);
        wVar7 = (*t->dblh_hook)(wVar7,wVar8);
        wVar9 = (wchar_t)tile_height;
        if (wVar7 != L'\0' || wVar6 != L'\0') {
          lVar11 = lVar11 - (ulong)(uint)wVar9;
          if ((int)lVar11 < t->y1) {
            t->y1 = (int)lVar11;
          }
          if (x < t->x1[lVar11]) {
            t->x1[lVar11] = x;
          }
          if (t->x2[lVar11] < x) {
            t->x2[lVar11] = x;
          }
        }
      }
      if (y < t->hgt - wVar9) {
        iVar10 = wVar9 + y;
        wVar7 = (*t->dblh_hook)(t->old->a[iVar10][x],t->old->c[iVar10][x]);
        wVar8 = (*t->dblh_hook)(t->old->ta[iVar10][x],t->old->tc[iVar10][x]);
        if (wVar8 != L'\0' || wVar7 != L'\0') {
          if (t->y2 < iVar10) {
            t->y2 = iVar10;
          }
          if (x < t->x1[iVar10]) {
            t->x1[iVar10] = x;
          }
          if (t->x2[iVar10] < x) {
            t->x2[iVar10] = x;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Term_queue_char(term *t, int x, int y, int a, wchar_t c, int ta,
					 wchar_t tc)
{
	int *scr_aa = t->scr->a[y];
	wchar_t *scr_cc = t->scr->c[y];

	int oa = scr_aa[x];
	wchar_t oc = scr_cc[x];

	int *scr_taa = t->scr->ta[y];
	wchar_t *scr_tcc = t->scr->tc[y];

	int ota = scr_taa[x];
	wchar_t otc = scr_tcc[x];

	/* Don't change is the terrain value is 0 */
	if (!ta) ta = ota;
	if (!tc) tc = otc;

	/* Hack -- Ignore non-changes */
	if ((oa == a) && (oc == c) && (ota == ta) && (otc == tc)) return;

	/* Save the "literal" information */
	scr_aa[x] = a;
	scr_cc[x] = c;

	scr_taa[x] = ta;
	scr_tcc[x] = tc;

	/* Check for new min/max row info */
	if (y < t->y1) t->y1 = y;
	if (y > t->y2) t->y2 = y;

	/* Check for new min/max col info for this row */
	if (x < t->x1[y]) t->x1[y] = x;
	if (x > t->x2[y]) t->x2[y] = x;

	if (t->dblh_hook) {
		/*
		 * If the previous contents are a double-height tile also
		 * adjust the modified bounds to encompass the position on
		 * the previous row of tiles so it can be included when
		 * redrawing at the next refresh.
		 */
		if (y >= tile_height) {
			int ofg_dbl = (*t->dblh_hook)(oa, oc);
			int obg_dbl = (*t->dblh_hook)(ota, otc);

			if (ofg_dbl || obg_dbl) {
				int yp = y - tile_height;

				if (yp < t->y1) t->y1 = yp;
				if (x < t->x1[yp]) t->x1[yp] = x;
				if (x > t->x2[yp]) t->x2[yp] = x;
			}
		}
		/*
		 * If the next row had a double-height tile, expand the modified
		 * bounds to encompass it as well since at least its upper
		 * half will need to be redrawn for the change here.
		 */
		if (y < t->hgt - tile_height) {
			int yn = y + tile_height;
			int ofg_dbl_nr = (*t->dblh_hook)(
				t->old->a[yn][x], t->old->c[yn][x]);
			int obg_dbl_nr = (*t->dblh_hook)(
				t->old->ta[yn][x], t->old->tc[yn][x]);

			if (ofg_dbl_nr || obg_dbl_nr) {
				if (yn > t->y2) t->y2 = yn;
				if (x < t->x1[yn]) t->x1[yn] = x;
				if (x > t->x2[yn]) t->x2[yn] = x;
			}
		}
	}
}